

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O3

void google::protobuf::Field::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  int iVar1;
  ulong uVar2;
  Arena *pAVar3;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *psVar4;
  MessageLite *this;
  string local_40;
  
  if (from_msg == to_msg) {
    psVar4 = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    pAVar3 = extraout_RDX;
LAB_00ebec59:
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
LAB_00ebe9bf:
    protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,psVar4,pAVar3);
  }
  else {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::Option>);
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((char)unaff_EBP == '\0') goto LAB_00ebec0c;
    if ((unaff_EBP & 1) != 0) {
      psVar4 = (string *)((ulong)from_msg[3]._vptr_MessageLite & 0xfffffffffffffffc);
      if (psVar4->_M_string_length != 0) {
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
        this = to_msg + 3;
        pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar3 & 1) != 0) goto LAB_00ebec59;
        goto LAB_00ebe9bf;
      }
      if (((ulong)to_msg[3]._vptr_MessageLite & 3) == 0) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,anon_var_dwarf_a22956 + 5);
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
        pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar3 & 1) != 0) {
          pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
        }
        protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)(to_msg + 3),&local_40,pAVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if ((unaff_EBP & 2) != 0) {
    psVar4 = (string *)(from_msg[3]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if (psVar4->_M_string_length == 0) {
      if ((to_msg[3]._internal_metadata_.ptr_ & 3) == 0) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,anon_var_dwarf_a22956 + 5);
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
        pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar3 & 1) != 0) {
          pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
        }
        protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[3]._internal_metadata_,&local_40,pAVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
      pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar3 & 1) != 0) {
        pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
      }
      protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)&to_msg[3]._internal_metadata_,psVar4,pAVar3);
    }
  }
  if ((unaff_EBP & 4) != 0) {
    psVar4 = (string *)((ulong)from_msg[4]._vptr_MessageLite & 0xfffffffffffffffc);
    if (psVar4->_M_string_length == 0) {
      if (((ulong)to_msg[4]._vptr_MessageLite & 3) == 0) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,anon_var_dwarf_a22956 + 5);
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 4;
        pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar3 & 1) != 0) {
          pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
        }
        protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)(to_msg + 4),&local_40,pAVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 4;
      pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar3 & 1) != 0) {
        pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
      }
      protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)(to_msg + 4),psVar4,pAVar3);
    }
  }
  if ((unaff_EBP & 8) != 0) {
    psVar4 = (string *)(from_msg[4]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if (psVar4->_M_string_length == 0) {
      if ((to_msg[4]._internal_metadata_.ptr_ & 3) == 0) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,anon_var_dwarf_a22956 + 5);
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 8;
        pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar3 & 1) != 0) {
          pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
        }
        protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[4]._internal_metadata_,&local_40,pAVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 8;
      pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar3 & 1) != 0) {
        pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
      }
      protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)&to_msg[4]._internal_metadata_,psVar4,pAVar3);
    }
  }
  if (((unaff_EBP & 0x10) != 0) && (*(int *)&from_msg[5]._vptr_MessageLite != 0)) {
    *(int *)&to_msg[5]._vptr_MessageLite = *(int *)&from_msg[5]._vptr_MessageLite;
  }
  if (((unaff_EBP & 0x20) != 0) &&
     (iVar1 = *(int *)((long)&from_msg[5]._vptr_MessageLite + 4), iVar1 != 0)) {
    *(int *)((long)&to_msg[5]._vptr_MessageLite + 4) = iVar1;
  }
  if (((unaff_EBP & 0x40) != 0) && (iVar1 = (int)from_msg[5]._internal_metadata_.ptr_, iVar1 != 0))
  {
    *(int *)&to_msg[5]._internal_metadata_.ptr_ = iVar1;
  }
  if (((char)unaff_EBP < '\0') &&
     (iVar1 = *(int *)((long)&from_msg[5]._internal_metadata_.ptr_ + 4), iVar1 != 0)) {
    *(int *)((long)&to_msg[5]._internal_metadata_.ptr_ + 4) = iVar1;
  }
LAB_00ebec0c:
  if (((unaff_EBP >> 8 & 1) != 0) && (*(char *)&from_msg[6]._vptr_MessageLite == '\x01')) {
    *(undefined1 *)&to_msg[6]._vptr_MessageLite = 1;
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

void Field::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Field*>(&to_msg);
  auto& from = static_cast<const Field&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Field)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_options()->MergeFrom(
      from._internal_options());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_name().empty()) {
        _this->_internal_set_name(from._internal_name());
      } else {
        if (_this->_impl_.name_.IsDefault()) {
          _this->_internal_set_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_type_url().empty()) {
        _this->_internal_set_type_url(from._internal_type_url());
      } else {
        if (_this->_impl_.type_url_.IsDefault()) {
          _this->_internal_set_type_url("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!from._internal_json_name().empty()) {
        _this->_internal_set_json_name(from._internal_json_name());
      } else {
        if (_this->_impl_.json_name_.IsDefault()) {
          _this->_internal_set_json_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!from._internal_default_value().empty()) {
        _this->_internal_set_default_value(from._internal_default_value());
      } else {
        if (_this->_impl_.default_value_.IsDefault()) {
          _this->_internal_set_default_value("");
        }
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_kind() != 0) {
        _this->_impl_.kind_ = from._impl_.kind_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_cardinality() != 0) {
        _this->_impl_.cardinality_ = from._impl_.cardinality_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_number() != 0) {
        _this->_impl_.number_ = from._impl_.number_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_oneof_index() != 0) {
        _this->_impl_.oneof_index_ = from._impl_.oneof_index_;
      }
    }
  }
  if ((cached_has_bits & 0x00000100u) != 0) {
    if (from._internal_packed() != 0) {
      _this->_impl_.packed_ = from._impl_.packed_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}